

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

string * __thiscall
util::make_string<char_const(&)[20],char_const*>
          (string *__return_storage_ptr__,util *this,char (*args) [20],char **args_1)

{
  char *__s;
  size_t sVar1;
  ostringstream ss;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)this,sVar1);
  __s = *(char **)*args;
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}